

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::EndDragDropSource(void)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->DragDropActive == false) {
    __assert_fail("g.DragDropActive",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                  ,0x22f9,"void ImGui::EndDragDropSource()");
  }
  if (GImGui->DragDropWithinSourceOrTarget != false) {
    if ((GImGui->DragDropSourceFlags & 1) == 0) {
      EndTooltip();
    }
    if ((pIVar1->DragDropPayload).DataFrameCount == -1) {
      ClearDragDrop();
    }
    pIVar1->DragDropWithinSourceOrTarget = false;
    return;
  }
  __assert_fail("g.DragDropWithinSourceOrTarget && \"Not after a BeginDragDropSource()?\"",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/imgui/imgui.cpp"
                ,0x22fa,"void ImGui::EndDragDropSource()");
}

Assistant:

void ImGui::EndDragDropSource()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.DragDropActive);
    IM_ASSERT(g.DragDropWithinSourceOrTarget && "Not after a BeginDragDropSource()?");

    if (!(g.DragDropSourceFlags & ImGuiDragDropFlags_SourceNoPreviewTooltip))
        EndTooltip();

    // Discard the drag if have not called SetDragDropPayload()
    if (g.DragDropPayload.DataFrameCount == -1)
        ClearDragDrop();
    g.DragDropWithinSourceOrTarget = false;
}